

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cpp
# Opt level: O2

bool __thiscall mahjong::Pair::isValueTiles(Pair *this,WiningState *state)

{
  Tile *pTVar1;
  bool bVar2;
  bool bVar3;
  IsSame local_2b;
  IsSame local_2a;
  IsDragon local_29;
  Tile local_28;
  Tile local_24;
  
  bVar2 = IsDragon::operator()
                    (&local_29,
                     (this->tiles).super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  bVar3 = true;
  if (!bVar2) {
    pTVar1 = (this->tiles).super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl
             .super__Vector_impl_data._M_start;
    local_24 = WiningState::roundWind(state);
    bVar2 = IsSame::operator()(&local_2a,pTVar1,&local_24);
    if (!bVar2) {
      pTVar1 = (this->tiles).super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_28 = WiningState::seatWind(state);
      bVar3 = IsSame::operator()(&local_2b,pTVar1,&local_28);
    }
  }
  return bVar3;
}

Assistant:

bool Pair::isValueTiles(const WiningState& state) const
{
	if (IsDragon()(tiles.front())) return true;
	if (IsSame()(tiles.front(), state.roundWind())) return true;
	if (IsSame()(tiles.front(), state.seatWind())) return true;

	return false;
}